

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsShaderConstExprTests.cpp
# Opt level: O3

vector<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_> *
deqp::gls::ShaderConstExpr::createTests
          (vector<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_> *__return_storage_ptr__,
          TestContext *testContext,RenderContext *renderContext,ContextInfo *contextInfo,
          TestParams *cases,int numCases,GLSLVersion version,TestShaderStage testStage)

{
  pointer pPVar1;
  int iVar2;
  mapped_type *pmVar3;
  char *pcVar4;
  char *pcVar5;
  undefined8 *puVar6;
  long *plVar7;
  ShaderLibraryCase *pSVar8;
  long *plVar9;
  TestNode *pTVar10;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar11;
  size_type *psVar12;
  pointer pRVar13;
  undefined8 uVar14;
  long lVar15;
  string mapped;
  string mapped_1;
  vector<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_> *ret;
  string caseName;
  string typeName;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  shaderTemplateParams;
  string expression;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  expressionTemplateParams;
  StringTemplate expressionTemplate;
  StringTemplate shaderTemplate;
  undefined1 local_2e0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2d0;
  DataType local_2b4;
  undefined1 local_2b0 [32];
  undefined1 uStack_290;
  undefined7 uStack_28f;
  bool bStack_288;
  ValueBlock local_280;
  vector<glu::sl::ProgramSpecification,_std::allocator<glu::sl::ProgramSpecification>_> vStack_238;
  key_type local_220;
  undefined1 local_200 [16];
  undefined1 local_1f0 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1d0;
  _Alloc_hider local_1c0;
  ContextInfo *local_1b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1b0;
  long local_1a0;
  pointer ppTStack_198;
  pointer local_190;
  pointer local_188;
  TestParams *local_180;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_178;
  ShaderLibraryCase *local_158 [2];
  undefined1 local_148 [24];
  char local_130 [8];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_128;
  _Alloc_hider local_118;
  pointer local_110;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_108;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_f8;
  undefined1 local_e8 [16];
  _Base_ptr local_d8;
  ContextInfo *local_d0;
  ContextInfo *local_c8;
  size_t local_c0;
  pointer local_b8;
  pointer local_b0;
  pointer local_a8;
  pointer local_a0;
  pointer local_98;
  pointer local_90;
  pointer local_88;
  pointer local_80;
  pointer local_78;
  StringTemplate local_70;
  StringTemplate local_50;
  
  local_2b0._0_8_ = local_2b0 + 0x10;
  local_1f0._16_8_ = __return_storage_ptr__;
  local_1d0._8_8_ = testContext;
  local_1c0._M_p = (pointer)renderContext;
  local_1b8 = contextInfo;
  local_180 = cases;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_2b0,
             "#version ${GLES_VERSION}\nprecision highp float;\nprecision highp int;\n${DECLARATIONS}\nvoid main()\n{\n\tconst ${CASE_BASE_TYPE} cval = ${CASE_EXPRESSION};\n\tout0 = cval;\n\t${OUTPUT}\n}\n"
             ,"");
  tcu::StringTemplate::StringTemplate(&local_50,(string *)local_2b0);
  if ((undefined1 *)local_2b0._0_8_ != local_2b0 + 0x10) {
    operator_delete((void *)local_2b0._0_8_,(ulong)(local_2b0._16_8_ + 1));
  }
  *(undefined8 *)local_1f0._16_8_ = 0;
  *(pointer *)(local_1f0._16_8_ + 8) = (pointer)0x0;
  *(pointer *)(local_1f0._16_8_ + 0x10) = (pointer)0x0;
  if (0 < numCases) {
    pcVar5 = "#version 100";
    if (version == GLSL_VERSION_300_ES) {
      pcVar5 = "#version 300 es";
    }
    local_a8 = (pointer)(pcVar5 + 9);
    local_b0 = (pointer)((ulong)(version == GLSL_VERSION_300_ES) * 3 + 3);
    pRVar13 = (pointer)0x0;
    local_b8 = (pointer)(ulong)(uint)numCases;
    do {
      local_130[0] = '\0';
      local_130[1] = '\0';
      local_130[2] = '\0';
      local_130[3] = '\0';
      local_128._M_allocated_capacity = 0;
      local_128._8_8_ = local_130;
      local_110 = (pointer)0x0;
      local_190 = (pointer)(ulong)local_180[(long)pRVar13].inType;
      local_188 = (pointer)(ulong)(uint)local_180[(long)pRVar13].minComponents;
      local_1f0._24_4_ = local_180[(long)pRVar13].maxComponents;
      local_2b4 = local_180[(long)pRVar13].outType;
      local_118._M_p = (pointer)local_128._8_8_;
      local_a0 = pRVar13;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_108._M_local_buf,local_180[(long)pRVar13].expression,
                 (allocator<char> *)local_2b0);
      local_78 = (pointer)std::__cxx11::string::find(local_108._M_local_buf,0x66c5df,0);
      local_2b0._0_8_ = local_2b0 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_2b0,"GLES_VERSION","");
      pmVar3 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)(local_148 + 0x10),(key_type *)local_2b0);
      std::__cxx11::string::_M_replace
                ((ulong)pmVar3,0,(char *)pmVar3->_M_string_length,(ulong)local_a8);
      if ((undefined1 *)local_2b0._0_8_ != local_2b0 + 0x10) {
        operator_delete((void *)local_2b0._0_8_,(ulong)(local_2b0._16_8_ + 1));
      }
      pcVar4 = glu::getDataTypeName(local_2b4);
      local_2b0._0_8_ = local_2b0 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_2b0,"CASE_BASE_TYPE","");
      pmVar3 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)(local_148 + 0x10),(key_type *)local_2b0);
      pcVar5 = (char *)pmVar3->_M_string_length;
      strlen(pcVar4);
      std::__cxx11::string::_M_replace((ulong)pmVar3,0,pcVar5,(ulong)pcVar4);
      if ((undefined1 *)local_2b0._0_8_ != local_2b0 + 0x10) {
        operator_delete((void *)local_2b0._0_8_,(ulong)(local_2b0._16_8_ + 1));
      }
      local_2b0._0_8_ = local_2b0 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_2b0,"DECLARATIONS","");
      pmVar3 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)(local_148 + 0x10),(key_type *)local_2b0);
      std::__cxx11::string::_M_replace((ulong)pmVar3,0,(char *)pmVar3->_M_string_length,0x63b4de);
      if ((undefined1 *)local_2b0._0_8_ != local_2b0 + 0x10) {
        operator_delete((void *)local_2b0._0_8_,(ulong)(local_2b0._16_8_ + 1));
      }
      local_2b0._0_8_ = local_2b0 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_2b0,"OUTPUT","");
      pmVar3 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)(local_148 + 0x10),(key_type *)local_2b0);
      std::__cxx11::string::_M_replace((ulong)pmVar3,0,(char *)pmVar3->_M_string_length,0x66c601);
      if ((undefined1 *)local_2b0._0_8_ != local_2b0 + 0x10) {
        operator_delete((void *)local_2b0._0_8_,(ulong)(local_2b0._16_8_ + 1));
      }
      iVar2 = (int)local_188;
      if (iVar2 + -1 < (int)local_1f0._24_4_) {
        local_1d0._M_allocated_capacity = (size_type)(local_180 + (long)pRVar13);
        local_98 = (pointer)(long)(iVar2 + -1);
        local_88 = (pointer)((long)local_98 * 8);
        local_80 = (pointer)(ulong)(uint)((int)local_190 + -1 + iVar2);
        local_90 = (pointer)(ulong)((local_1f0._24_4_ - iVar2) + 1);
        lVar15 = 0;
        do {
          local_e8._8_4_ = _S_red;
          local_d8 = (_Base_ptr)0x0;
          local_d0 = (ContextInfo *)(local_e8 + 8);
          local_c0 = 0;
          local_c8 = local_d0;
          pcVar5 = glu::getDataTypeName((int)local_80 + (int)lVar15);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_178,pcVar5,(allocator<char> *)local_2b0);
          tcu::StringTemplate::StringTemplate(&local_70,(string *)&local_108);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)local_2b0,*(char **)local_1d0._M_allocated_capacity,
                     (allocator<char> *)&local_220);
          if ((int)local_188 == local_1f0._24_4_) {
            local_2e0._0_8_ = &local_2d0;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_2e0,"");
          }
          else {
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_2e0,"_",&local_178);
          }
          pcVar5 = (char *)0xf;
          if ((undefined1 *)local_2b0._0_8_ != local_2b0 + 0x10) {
            pcVar5 = (char *)local_2b0._16_8_;
          }
          if (pcVar5 < (char *)(local_2e0._8_8_ + local_2b0._8_8_)) {
            uVar14 = (char *)0xf;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2e0._0_8_ != &local_2d0) {
              uVar14 = local_2d0._M_allocated_capacity;
            }
            if ((ulong)uVar14 < (char *)(local_2e0._8_8_ + local_2b0._8_8_)) goto LAB_00484ce2;
            puVar6 = (undefined8 *)
                     std::__cxx11::string::replace((ulong)local_2e0,0,(char *)0x0,local_2b0._0_8_);
          }
          else {
LAB_00484ce2:
            puVar6 = (undefined8 *)
                     std::__cxx11::string::_M_append((char *)local_2b0,local_2e0._0_8_);
          }
          local_1b0._M_allocated_capacity = (size_type)&local_1a0;
          plVar7 = puVar6 + 2;
          if ((long *)*puVar6 == plVar7) {
            local_1a0 = *plVar7;
            ppTStack_198 = (pointer)puVar6[3];
          }
          else {
            local_1a0 = *plVar7;
            local_1b0._M_allocated_capacity = (size_type)(long *)*puVar6;
          }
          local_1b0._8_8_ = puVar6[1];
          *puVar6 = plVar7;
          puVar6[1] = 0;
          *(undefined1 *)plVar7 = 0;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2e0._0_8_ != &local_2d0) {
            operator_delete((void *)local_2e0._0_8_,(ulong)(local_2d0._M_allocated_capacity + 1));
          }
          if ((undefined1 *)local_2b0._0_8_ != local_2b0 + 0x10) {
            operator_delete((void *)local_2b0._0_8_,(ulong)(local_2b0._16_8_ + 1));
          }
          local_2b0._0_8_ = local_2b0 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_2b0,"T","");
          pmVar3 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 *)local_e8,(key_type *)local_2b0);
          std::__cxx11::string::_M_assign((string *)pmVar3);
          if ((undefined1 *)local_2b0._0_8_ != local_2b0 + 0x10) {
            operator_delete((void *)local_2b0._0_8_,(ulong)(local_2b0._16_8_ + 1));
          }
          local_2b0._0_8_ = local_2b0 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_2b0,"MT","");
          pmVar3 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 *)local_e8,(key_type *)local_2b0);
          std::__cxx11::string::_M_assign((string *)pmVar3);
          if ((undefined1 *)local_2b0._0_8_ != local_2b0 + 0x10) {
            operator_delete((void *)local_2b0._0_8_,(ulong)(local_2b0._16_8_ + 1));
          }
          tcu::StringTemplate::specialize
                    ((string *)local_2e0,&local_70,
                     (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)local_e8);
          plVar7 = (long *)std::__cxx11::string::append((char *)local_2e0);
          local_2b0._0_8_ = local_2b0 + 0x10;
          plVar9 = plVar7 + 2;
          if ((long *)*plVar7 == plVar9) {
            local_2b0._16_8_ = *plVar9;
            local_2b0._24_4_ = (undefined4)plVar7[3];
            local_2b0._28_4_ = *(undefined4 *)((long)plVar7 + 0x1c);
          }
          else {
            local_2b0._16_8_ = *plVar9;
            local_2b0._0_8_ = (long *)*plVar7;
          }
          local_2b0._8_8_ = plVar7[1];
          *plVar7 = (long)plVar9;
          plVar7[1] = 0;
          *(undefined1 *)(plVar7 + 2) = 0;
          local_220._M_dataplus._M_p = (pointer)&local_220.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_220,"CASE_EXPRESSION","")
          ;
          pmVar3 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 *)(local_148 + 0x10),&local_220);
          std::__cxx11::string::operator=((string *)pmVar3,(string *)local_2b0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_220._M_dataplus._M_p != &local_220.field_2) {
            operator_delete(local_220._M_dataplus._M_p,local_220.field_2._M_allocated_capacity + 1);
          }
          if ((undefined1 *)local_2b0._0_8_ != local_2b0 + 0x10) {
            operator_delete((void *)local_2b0._0_8_,(ulong)(local_2b0._16_8_ + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2e0._0_8_ != &local_2d0) {
            operator_delete((void *)local_2e0._0_8_,(ulong)(local_2d0._M_allocated_capacity + 1));
          }
          tcu::StringTemplate::specialize
                    (&local_220,&local_50,
                     (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)(local_148 + 0x10));
          if ((testStage & SHADER_VERTEX) != 0) {
            uStack_290 = 0;
            uStack_28f = 0;
            bStack_288 = false;
            local_2b0._16_8_ = (char *)0x0;
            local_2b0._24_4_ = 0;
            local_2b0._28_4_ = 0;
            vStack_238.
            super__Vector_base<glu::sl::ProgramSpecification,_std::allocator<glu::sl::ProgramSpecification>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            vStack_238.
            super__Vector_base<glu::sl::ProgramSpecification,_std::allocator<glu::sl::ProgramSpecification>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            local_280.uniforms.super__Vector_base<glu::sl::Value,_std::allocator<glu::sl::Value>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            vStack_238.
            super__Vector_base<glu::sl::ProgramSpecification,_std::allocator<glu::sl::ProgramSpecification>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            local_280.uniforms.super__Vector_base<glu::sl::Value,_std::allocator<glu::sl::Value>_>.
            _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            local_280.uniforms.super__Vector_base<glu::sl::Value,_std::allocator<glu::sl::Value>_>.
            _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            local_280.outputs.super__Vector_base<glu::sl::Value,_std::allocator<glu::sl::Value>_>.
            _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            local_280.outputs.super__Vector_base<glu::sl::Value,_std::allocator<glu::sl::Value>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            local_280.inputs.super__Vector_base<glu::sl::Value,_std::allocator<glu::sl::Value>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            local_280.outputs.super__Vector_base<glu::sl::Value,_std::allocator<glu::sl::Value>_>.
            _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            local_280.inputs.super__Vector_base<glu::sl::Value,_std::allocator<glu::sl::Value>_>.
            _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            local_280.inputs.super__Vector_base<glu::sl::Value,_std::allocator<glu::sl::Value>_>.
            _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            local_2b0._8_4_ = version;
            local_2b0._0_8_ = (pointer)0x1;
            std::
            vector<glu::sl::ProgramSpecification,_std::allocator<glu::sl::ProgramSpecification>_>::
            resize(&vStack_238,1);
            pPVar1 = vStack_238.
                     super__Vector_base<glu::sl::ProgramSpecification,_std::allocator<glu::sl::ProgramSpecification>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            local_2e0._0_8_ = local_2e0._0_8_ & 0xffffffff00000000;
            local_2e0._8_8_ = local_2d0._M_local_buf + 8;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)(local_2e0 + 8),local_220._M_dataplus._M_p,
                       local_220._M_dataplus._M_p + local_220._M_string_length);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back((pPVar1->sources).sources + (local_2e0._0_8_ & 0xffffffff),
                        (value_type *)(local_2e0 + 8));
            if ((char *)local_2e0._8_8_ != local_2d0._M_local_buf + 8) {
              operator_delete((void *)local_2e0._8_8_,local_2d0._8_8_ + 1);
            }
            addOutputVar(&local_280,local_2b4,*(float *)(local_1d0._M_allocated_capacity + 0x20));
            pSVar8 = (ShaderLibraryCase *)operator_new(0x110);
            local_2e0._0_8_ = &local_2d0;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)local_2e0,local_1b0._M_allocated_capacity,
                       (undefined1 *)(local_1b0._8_8_ + local_1b0._M_allocated_capacity));
            std::__cxx11::string::append((char *)local_2e0);
            ShaderLibraryCase::ShaderLibraryCase
                      (pSVar8,(TestContext *)local_1d0._8_8_,(RenderContext *)local_1c0._M_p,
                       local_1b8,(char *)local_2e0._0_8_,"",(ShaderCaseSpecification *)local_2b0);
            local_200._0_8_ = pSVar8;
            std::vector<tcu::TestNode*,std::allocator<tcu::TestNode*>>::emplace_back<tcu::TestNode*>
                      ((vector<tcu::TestNode*,std::allocator<tcu::TestNode*>> *)local_1f0._16_8_,
                       (TestNode **)local_200);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2e0._0_8_ != &local_2d0) {
              operator_delete((void *)local_2e0._0_8_,(ulong)(local_2d0._M_allocated_capacity + 1));
            }
            std::
            vector<glu::sl::ProgramSpecification,_std::allocator<glu::sl::ProgramSpecification>_>::
            ~vector(&vStack_238);
            std::vector<glu::sl::Value,_std::allocator<glu::sl::Value>_>::~vector
                      (&local_280.uniforms);
            std::vector<glu::sl::Value,_std::allocator<glu::sl::Value>_>::~vector
                      (&local_280.outputs);
            std::vector<glu::sl::Value,_std::allocator<glu::sl::Value>_>::~vector(&local_280.inputs)
            ;
            if ((char *)local_2b0._16_8_ != (char *)0x0) {
              operator_delete((void *)local_2b0._16_8_,
                              CONCAT71(uStack_28f,uStack_290) - local_2b0._16_8_);
            }
          }
          if ((testStage & SHADER_FRAGMENT) != 0) {
            uStack_290 = 0;
            uStack_28f = 0;
            bStack_288 = false;
            local_2b0._16_8_ = (char *)0x0;
            local_2b0._24_4_ = 0;
            local_2b0._28_4_ = 0;
            vStack_238.
            super__Vector_base<glu::sl::ProgramSpecification,_std::allocator<glu::sl::ProgramSpecification>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            vStack_238.
            super__Vector_base<glu::sl::ProgramSpecification,_std::allocator<glu::sl::ProgramSpecification>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            local_280.uniforms.super__Vector_base<glu::sl::Value,_std::allocator<glu::sl::Value>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            vStack_238.
            super__Vector_base<glu::sl::ProgramSpecification,_std::allocator<glu::sl::ProgramSpecification>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            local_280.uniforms.super__Vector_base<glu::sl::Value,_std::allocator<glu::sl::Value>_>.
            _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            local_280.uniforms.super__Vector_base<glu::sl::Value,_std::allocator<glu::sl::Value>_>.
            _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            local_280.outputs.super__Vector_base<glu::sl::Value,_std::allocator<glu::sl::Value>_>.
            _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            local_280.outputs.super__Vector_base<glu::sl::Value,_std::allocator<glu::sl::Value>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            local_280.inputs.super__Vector_base<glu::sl::Value,_std::allocator<glu::sl::Value>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            local_280.outputs.super__Vector_base<glu::sl::Value,_std::allocator<glu::sl::Value>_>.
            _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            local_280.inputs.super__Vector_base<glu::sl::Value,_std::allocator<glu::sl::Value>_>.
            _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            local_280.inputs.super__Vector_base<glu::sl::Value,_std::allocator<glu::sl::Value>_>.
            _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            local_2b0._8_4_ = version;
            local_2b0._0_8_ = (pointer)0x2;
            std::
            vector<glu::sl::ProgramSpecification,_std::allocator<glu::sl::ProgramSpecification>_>::
            resize(&vStack_238,1);
            pPVar1 = vStack_238.
                     super__Vector_base<glu::sl::ProgramSpecification,_std::allocator<glu::sl::ProgramSpecification>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            local_2e0._0_4_ = 1;
            local_2e0._8_8_ = local_2d0._M_local_buf + 8;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)(local_2e0 + 8),local_220._M_dataplus._M_p,
                       local_220._M_dataplus._M_p + local_220._M_string_length);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back((pPVar1->sources).sources + (local_2e0._0_8_ & 0xffffffff),
                        (value_type *)(local_2e0 + 8));
            if ((char *)local_2e0._8_8_ != local_2d0._M_local_buf + 8) {
              operator_delete((void *)local_2e0._8_8_,local_2d0._8_8_ + 1);
            }
            addOutputVar(&local_280,local_2b4,*(float *)(local_1d0._M_allocated_capacity + 0x20));
            pSVar8 = (ShaderLibraryCase *)operator_new(0x110);
            local_2e0._0_8_ = &local_2d0;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)local_2e0,local_1b0._M_allocated_capacity,
                       (undefined1 *)(local_1b0._8_8_ + local_1b0._M_allocated_capacity));
            std::__cxx11::string::append((char *)local_2e0);
            ShaderLibraryCase::ShaderLibraryCase
                      (pSVar8,(TestContext *)local_1d0._8_8_,(RenderContext *)local_1c0._M_p,
                       local_1b8,(char *)local_2e0._0_8_,"",(ShaderCaseSpecification *)local_2b0);
            local_200._0_8_ = pSVar8;
            std::vector<tcu::TestNode*,std::allocator<tcu::TestNode*>>::emplace_back<tcu::TestNode*>
                      ((vector<tcu::TestNode*,std::allocator<tcu::TestNode*>> *)local_1f0._16_8_,
                       (TestNode **)local_200);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2e0._0_8_ != &local_2d0) {
              operator_delete((void *)local_2e0._0_8_,(ulong)(local_2d0._M_allocated_capacity + 1));
            }
            std::
            vector<glu::sl::ProgramSpecification,_std::allocator<glu::sl::ProgramSpecification>_>::
            ~vector(&vStack_238);
            std::vector<glu::sl::Value,_std::allocator<glu::sl::Value>_>::~vector
                      (&local_280.uniforms);
            std::vector<glu::sl::Value,_std::allocator<glu::sl::Value>_>::~vector
                      (&local_280.outputs);
            std::vector<glu::sl::Value,_std::allocator<glu::sl::Value>_>::~vector(&local_280.inputs)
            ;
            if ((char *)local_2b0._16_8_ != (char *)0x0) {
              operator_delete((void *)local_2b0._16_8_,
                              CONCAT71(uStack_28f,uStack_290) - local_2b0._16_8_);
            }
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_220._M_dataplus._M_p != &local_220.field_2) {
            operator_delete(local_220._M_dataplus._M_p,local_220.field_2._M_allocated_capacity + 1);
          }
          if ((local_78 != (pointer)0xffffffffffffffff) &&
             (0 < (long)&(local_98->type).m_type + lVar15)) {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)local_158,*(char **)local_1d0._M_allocated_capacity,
                       (allocator<char> *)(local_1f0 + 0x1f));
            plVar7 = (long *)std::__cxx11::string::append((char *)local_158);
            local_200._0_8_ = local_1f0;
            pTVar10 = (TestNode *)(plVar7 + 2);
            if ((TestNode *)*plVar7 == pTVar10) {
              local_1f0._0_8_ = pTVar10->_vptr_TestNode;
              local_1f0._8_8_ = plVar7[3];
            }
            else {
              local_1f0._0_8_ = pTVar10->_vptr_TestNode;
              local_200._0_8_ = (TestNode *)*plVar7;
            }
            local_200._8_8_ = plVar7[1];
            *plVar7 = (long)pTVar10;
            plVar7[1] = 0;
            *(undefined1 *)(plVar7 + 2) = 0;
            plVar7 = (long *)std::__cxx11::string::_M_append
                                       (local_200,(ulong)local_178._M_dataplus._M_p);
            local_2e0._0_8_ = &local_2d0;
            paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(plVar7 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar7 == paVar11) {
              local_2d0._M_allocated_capacity = paVar11->_M_allocated_capacity;
              local_2d0._8_8_ = plVar7[3];
            }
            else {
              local_2d0._M_allocated_capacity = paVar11->_M_allocated_capacity;
              local_2e0._0_8_ =
                   (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)*plVar7;
            }
            local_2e0._8_8_ = plVar7[1];
            *plVar7 = (long)paVar11;
            plVar7[1] = 0;
            *(undefined1 *)(plVar7 + 2) = 0;
            plVar7 = (long *)std::__cxx11::string::append(local_2e0);
            local_2b0._0_8_ = local_2b0 + 0x10;
            psVar12 = (size_type *)(plVar7 + 2);
            if ((size_type *)*plVar7 == psVar12) {
              local_2b0._16_8_ = *psVar12;
              local_2b0._24_4_ = (undefined4)plVar7[3];
              local_2b0._28_4_ = (undefined4)((ulong)plVar7[3] >> 0x20);
            }
            else {
              local_2b0._16_8_ = *psVar12;
              local_2b0._0_8_ = (size_type *)*plVar7;
            }
            local_2b0._8_8_ = plVar7[1];
            *plVar7 = (long)psVar12;
            plVar7[1] = 0;
            *(undefined1 *)(plVar7 + 2) = 0;
            glu::getDataTypeName((DataType)local_190);
            plVar7 = (long *)std::__cxx11::string::append((char *)local_2b0);
            local_220._M_dataplus._M_p = (pointer)&local_220.field_2;
            psVar12 = (size_type *)(plVar7 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar7 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar12) {
              local_220.field_2._M_allocated_capacity = *psVar12;
              local_220.field_2._8_8_ = plVar7[3];
            }
            else {
              local_220.field_2._M_allocated_capacity = *psVar12;
              local_220._M_dataplus._M_p = (pointer)*plVar7;
            }
            local_220._M_string_length = plVar7[1];
            *plVar7 = (long)psVar12;
            plVar7[1] = 0;
            *(undefined1 *)(plVar7 + 2) = 0;
            if ((undefined1 *)local_2b0._0_8_ != local_2b0 + 0x10) {
              operator_delete((void *)local_2b0._0_8_,local_2b0._16_8_ + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2e0._0_8_ != &local_2d0) {
              operator_delete((void *)local_2e0._0_8_,(ulong)(local_2d0._M_allocated_capacity + 1));
            }
            if ((TestNode *)local_200._0_8_ != (TestNode *)local_1f0) {
              operator_delete((void *)local_200._0_8_,local_1f0._0_8_ + 1);
            }
            if (local_158[0] != (ShaderLibraryCase *)local_148) {
              operator_delete(local_158[0],local_148._0_8_ + 1);
            }
            pcVar4 = glu::getDataTypeName((DataType)local_190);
            local_2b0._0_8_ = local_2b0 + 0x10;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_2b0,"MT","");
            pmVar3 = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                   *)local_e8,(key_type *)local_2b0);
            pcVar5 = (char *)pmVar3->_M_string_length;
            strlen(pcVar4);
            std::__cxx11::string::_M_replace((ulong)pmVar3,0,pcVar5,(ulong)pcVar4);
            if ((undefined1 *)local_2b0._0_8_ != local_2b0 + 0x10) {
              operator_delete((void *)local_2b0._0_8_,local_2b0._16_8_ + 1);
            }
            tcu::StringTemplate::specialize
                      ((string *)local_2e0,&local_70,
                       (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)local_e8);
            plVar7 = (long *)std::__cxx11::string::append((char *)local_2e0);
            local_2b0._0_8_ = local_2b0 + 0x10;
            plVar9 = plVar7 + 2;
            if ((long *)*plVar7 == plVar9) {
              local_2b0._16_8_ = *plVar9;
              local_2b0._24_4_ = (undefined4)plVar7[3];
              local_2b0._28_4_ = *(undefined4 *)((long)plVar7 + 0x1c);
            }
            else {
              local_2b0._16_8_ = *plVar9;
              local_2b0._0_8_ = (long *)*plVar7;
            }
            local_2b0._8_8_ = plVar7[1];
            *plVar7 = (long)plVar9;
            plVar7[1] = 0;
            *(undefined1 *)(plVar7 + 2) = 0;
            local_200._0_8_ = local_1f0;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_200,"CASE_EXPRESSION","");
            pmVar3 = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                   *)(local_148 + 0x10),(key_type *)local_200);
            std::__cxx11::string::operator=((string *)pmVar3,(string *)local_2b0);
            if ((ShaderLibraryCase *)local_200._0_8_ != (ShaderLibraryCase *)local_1f0) {
              operator_delete((void *)local_200._0_8_,local_1f0._0_8_ + 1);
            }
            if ((undefined1 *)local_2b0._0_8_ != local_2b0 + 0x10) {
              operator_delete((void *)local_2b0._0_8_,(ulong)(local_2b0._16_8_ + 1));
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2e0._0_8_ != &local_2d0) {
              operator_delete((void *)local_2e0._0_8_,(ulong)(local_2d0._M_allocated_capacity + 1));
            }
            tcu::StringTemplate::specialize
                      ((string *)local_200,&local_50,
                       (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)(local_148 + 0x10));
            if ((testStage & SHADER_VERTEX) != 0) {
              uStack_290 = 0;
              uStack_28f = 0;
              bStack_288 = false;
              local_2b0._16_8_ = (char *)0x0;
              local_2b0._24_4_ = 0;
              local_2b0._28_4_ = 0;
              vStack_238.
              super__Vector_base<glu::sl::ProgramSpecification,_std::allocator<glu::sl::ProgramSpecification>_>
              ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
              vStack_238.
              super__Vector_base<glu::sl::ProgramSpecification,_std::allocator<glu::sl::ProgramSpecification>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              local_280.uniforms.super__Vector_base<glu::sl::Value,_std::allocator<glu::sl::Value>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              vStack_238.
              super__Vector_base<glu::sl::ProgramSpecification,_std::allocator<glu::sl::ProgramSpecification>_>
              ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
              local_280.uniforms.super__Vector_base<glu::sl::Value,_std::allocator<glu::sl::Value>_>
              ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
              local_280.uniforms.super__Vector_base<glu::sl::Value,_std::allocator<glu::sl::Value>_>
              ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
              local_280.outputs.super__Vector_base<glu::sl::Value,_std::allocator<glu::sl::Value>_>.
              _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
              local_280.outputs.super__Vector_base<glu::sl::Value,_std::allocator<glu::sl::Value>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              local_280.inputs.super__Vector_base<glu::sl::Value,_std::allocator<glu::sl::Value>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              local_280.outputs.super__Vector_base<glu::sl::Value,_std::allocator<glu::sl::Value>_>.
              _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
              local_280.inputs.super__Vector_base<glu::sl::Value,_std::allocator<glu::sl::Value>_>.
              _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
              local_280.inputs.super__Vector_base<glu::sl::Value,_std::allocator<glu::sl::Value>_>.
              _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
              local_2b0._8_4_ = version;
              local_2b0._0_8_ = (pointer)0x1;
              std::
              vector<glu::sl::ProgramSpecification,_std::allocator<glu::sl::ProgramSpecification>_>
              ::resize(&vStack_238,1);
              pPVar1 = vStack_238.
                       super__Vector_base<glu::sl::ProgramSpecification,_std::allocator<glu::sl::ProgramSpecification>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              local_2e0._0_8_ = local_2e0._0_8_ & 0xffffffff00000000;
              local_2e0._8_8_ = local_2d0._M_local_buf + 8;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)(local_2e0 + 8),local_200._0_8_,
                         (pointer)(local_200._0_8_ + local_200._8_8_));
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::push_back((pPVar1->sources).sources + (local_2e0._0_8_ & 0xffffffff),
                          (value_type *)(local_2e0 + 8));
              if ((char *)local_2e0._8_8_ != local_2d0._M_local_buf + 8) {
                operator_delete((void *)local_2e0._8_8_,local_2d0._8_8_ + 1);
              }
              addOutputVar(&local_280,local_2b4,*(float *)(local_1d0._M_allocated_capacity + 0x20));
              pSVar8 = (ShaderLibraryCase *)operator_new(0x110);
              local_2e0._0_8_ = &local_2d0;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)local_2e0,local_220._M_dataplus._M_p,
                         local_220._M_dataplus._M_p + local_220._M_string_length);
              std::__cxx11::string::append((char *)local_2e0);
              ShaderLibraryCase::ShaderLibraryCase
                        (pSVar8,(TestContext *)local_1d0._8_8_,(RenderContext *)local_1c0._M_p,
                         local_1b8,(char *)local_2e0._0_8_,"",(ShaderCaseSpecification *)local_2b0);
              local_158[0] = pSVar8;
              std::vector<tcu::TestNode*,std::allocator<tcu::TestNode*>>::
              emplace_back<tcu::TestNode*>
                        ((vector<tcu::TestNode*,std::allocator<tcu::TestNode*>> *)local_1f0._16_8_,
                         (TestNode **)local_158);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_2e0._0_8_ != &local_2d0) {
                operator_delete((void *)local_2e0._0_8_,(ulong)(local_2d0._M_allocated_capacity + 1)
                               );
              }
              std::
              vector<glu::sl::ProgramSpecification,_std::allocator<glu::sl::ProgramSpecification>_>
              ::~vector(&vStack_238);
              std::vector<glu::sl::Value,_std::allocator<glu::sl::Value>_>::~vector
                        (&local_280.uniforms);
              std::vector<glu::sl::Value,_std::allocator<glu::sl::Value>_>::~vector
                        (&local_280.outputs);
              std::vector<glu::sl::Value,_std::allocator<glu::sl::Value>_>::~vector
                        (&local_280.inputs);
              if ((char *)local_2b0._16_8_ != (char *)0x0) {
                operator_delete((void *)local_2b0._16_8_,
                                CONCAT71(uStack_28f,uStack_290) - local_2b0._16_8_);
              }
            }
            if ((testStage & SHADER_FRAGMENT) != 0) {
              uStack_290 = 0;
              uStack_28f = 0;
              bStack_288 = false;
              local_2b0._16_8_ = (char *)0x0;
              local_2b0._24_4_ = 0;
              local_2b0._28_4_ = 0;
              vStack_238.
              super__Vector_base<glu::sl::ProgramSpecification,_std::allocator<glu::sl::ProgramSpecification>_>
              ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
              vStack_238.
              super__Vector_base<glu::sl::ProgramSpecification,_std::allocator<glu::sl::ProgramSpecification>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              local_280.uniforms.super__Vector_base<glu::sl::Value,_std::allocator<glu::sl::Value>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              vStack_238.
              super__Vector_base<glu::sl::ProgramSpecification,_std::allocator<glu::sl::ProgramSpecification>_>
              ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
              local_280.uniforms.super__Vector_base<glu::sl::Value,_std::allocator<glu::sl::Value>_>
              ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
              local_280.uniforms.super__Vector_base<glu::sl::Value,_std::allocator<glu::sl::Value>_>
              ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
              local_280.outputs.super__Vector_base<glu::sl::Value,_std::allocator<glu::sl::Value>_>.
              _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
              local_280.outputs.super__Vector_base<glu::sl::Value,_std::allocator<glu::sl::Value>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              local_280.inputs.super__Vector_base<glu::sl::Value,_std::allocator<glu::sl::Value>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              local_280.outputs.super__Vector_base<glu::sl::Value,_std::allocator<glu::sl::Value>_>.
              _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
              local_280.inputs.super__Vector_base<glu::sl::Value,_std::allocator<glu::sl::Value>_>.
              _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
              local_280.inputs.super__Vector_base<glu::sl::Value,_std::allocator<glu::sl::Value>_>.
              _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
              local_2b0._8_4_ = version;
              local_2b0._0_8_ = (pointer)0x2;
              std::
              vector<glu::sl::ProgramSpecification,_std::allocator<glu::sl::ProgramSpecification>_>
              ::resize(&vStack_238,1);
              pPVar1 = vStack_238.
                       super__Vector_base<glu::sl::ProgramSpecification,_std::allocator<glu::sl::ProgramSpecification>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              local_2e0._0_4_ = 1;
              local_2e0._8_8_ = local_2d0._M_local_buf + 8;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)(local_2e0 + 8),local_200._0_8_,
                         (pointer)(local_200._0_8_ + local_200._8_8_));
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::push_back((pPVar1->sources).sources + (local_2e0._0_8_ & 0xffffffff),
                          (value_type *)(local_2e0 + 8));
              if ((char *)local_2e0._8_8_ != local_2d0._M_local_buf + 8) {
                operator_delete((void *)local_2e0._8_8_,local_2d0._8_8_ + 1);
              }
              addOutputVar(&local_280,local_2b4,*(float *)(local_1d0._M_allocated_capacity + 0x20));
              pSVar8 = (ShaderLibraryCase *)operator_new(0x110);
              local_2e0._0_8_ = &local_2d0;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)local_2e0,local_220._M_dataplus._M_p,
                         local_220._M_dataplus._M_p + local_220._M_string_length);
              std::__cxx11::string::append((char *)local_2e0);
              ShaderLibraryCase::ShaderLibraryCase
                        (pSVar8,(TestContext *)local_1d0._8_8_,(RenderContext *)local_1c0._M_p,
                         local_1b8,(char *)local_2e0._0_8_,"",(ShaderCaseSpecification *)local_2b0);
              local_158[0] = pSVar8;
              std::vector<tcu::TestNode*,std::allocator<tcu::TestNode*>>::
              emplace_back<tcu::TestNode*>
                        ((vector<tcu::TestNode*,std::allocator<tcu::TestNode*>> *)local_1f0._16_8_,
                         (TestNode **)local_158);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_2e0._0_8_ != &local_2d0) {
                operator_delete((void *)local_2e0._0_8_,(ulong)(local_2d0._M_allocated_capacity + 1)
                               );
              }
              std::
              vector<glu::sl::ProgramSpecification,_std::allocator<glu::sl::ProgramSpecification>_>
              ::~vector(&vStack_238);
              std::vector<glu::sl::Value,_std::allocator<glu::sl::Value>_>::~vector
                        (&local_280.uniforms);
              std::vector<glu::sl::Value,_std::allocator<glu::sl::Value>_>::~vector
                        (&local_280.outputs);
              std::vector<glu::sl::Value,_std::allocator<glu::sl::Value>_>::~vector
                        (&local_280.inputs);
              if ((char *)local_2b0._16_8_ != (char *)0x0) {
                operator_delete((void *)local_2b0._16_8_,
                                CONCAT71(uStack_28f,uStack_290) - local_2b0._16_8_);
              }
            }
            if ((ShaderLibraryCase *)local_200._0_8_ != (ShaderLibraryCase *)local_1f0) {
              operator_delete((void *)local_200._0_8_,local_1f0._0_8_ + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_220._M_dataplus._M_p != &local_220.field_2) {
              operator_delete(local_220._M_dataplus._M_p,local_220.field_2._M_allocated_capacity + 1
                             );
            }
          }
          if ((long *)local_1b0._M_allocated_capacity != &local_1a0) {
            operator_delete((void *)local_1b0._M_allocated_capacity,local_1a0 + 1);
          }
          tcu::StringTemplate::~StringTemplate(&local_70);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_178._M_dataplus._M_p != &local_178.field_2) {
            operator_delete(local_178._M_dataplus._M_p,local_178.field_2._M_allocated_capacity + 1);
          }
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       *)local_e8);
          lVar15 = lVar15 + 1;
        } while ((int)local_90 != (int)lVar15);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_108._M_allocated_capacity != &local_f8) {
        operator_delete((void *)local_108._M_allocated_capacity,
                        (ulong)(local_f8._M_allocated_capacity + 1));
      }
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)(local_148 + 0x10));
      pRVar13 = (pointer)((long)&local_a0->enumName + 1);
    } while (pRVar13 != local_b8);
  }
  tcu::StringTemplate::~StringTemplate(&local_50);
  return (vector<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_> *)
         (vector<tcu::TestNode*,std::allocator<tcu::TestNode*>> *)local_1f0._16_8_;
}

Assistant:

std::vector<tcu::TestNode*> createTests (tcu::TestContext&			testContext,
										 glu::RenderContext&		renderContext,
										 const glu::ContextInfo&	contextInfo,
										 const TestParams*			cases,
										 int						numCases,
										 glu::GLSLVersion			version,
										 TestShaderStage			testStage)
{
	using std::string;
	using std::vector;
	using gls::ShaderLibraryCase;

	// Needed for autogenerating shader code for increased component counts
	DE_STATIC_ASSERT(glu::TYPE_FLOAT+1 == glu::TYPE_FLOAT_VEC2);
	DE_STATIC_ASSERT(glu::TYPE_FLOAT+2 == glu::TYPE_FLOAT_VEC3);
	DE_STATIC_ASSERT(glu::TYPE_FLOAT+3 == glu::TYPE_FLOAT_VEC4);

	DE_STATIC_ASSERT(glu::TYPE_INT+1 == glu::TYPE_INT_VEC2);
	DE_STATIC_ASSERT(glu::TYPE_INT+2 == glu::TYPE_INT_VEC3);
	DE_STATIC_ASSERT(glu::TYPE_INT+3 == glu::TYPE_INT_VEC4);

	DE_STATIC_ASSERT(glu::TYPE_UINT+1 == glu::TYPE_UINT_VEC2);
	DE_STATIC_ASSERT(glu::TYPE_UINT+2 == glu::TYPE_UINT_VEC3);
	DE_STATIC_ASSERT(glu::TYPE_UINT+3 == glu::TYPE_UINT_VEC4);

	DE_STATIC_ASSERT(glu::TYPE_BOOL+1 == glu::TYPE_BOOL_VEC2);
	DE_STATIC_ASSERT(glu::TYPE_BOOL+2 == glu::TYPE_BOOL_VEC3);
	DE_STATIC_ASSERT(glu::TYPE_BOOL+3 == glu::TYPE_BOOL_VEC4);

	DE_ASSERT(testStage);

	const char* shaderTemplateSrc =
		"#version ${GLES_VERSION}\n"
		"precision highp float;\n"
		"precision highp int;\n"
		"${DECLARATIONS}\n"
		"void main()\n"
		"{\n"
		"	const ${CASE_BASE_TYPE} cval = ${CASE_EXPRESSION};\n"
		"	out0 = cval;\n"
		"	${OUTPUT}\n"
		"}\n";

	const tcu::StringTemplate	shaderTemplate	(shaderTemplateSrc);
	vector<tcu::TestNode*>		ret;

	for (int caseNdx = 0; caseNdx < numCases; caseNdx++)
	{
		std::map<string, string>	shaderTemplateParams;
		const int					minComponents	= cases[caseNdx].minComponents;
		const int					maxComponents	= cases[caseNdx].maxComponents;
		const DataType				inType			= cases[caseNdx].inType;
		const DataType				outType			= cases[caseNdx].outType;
		const string				expression		= cases[caseNdx].expression;
		// Check for presence of func(vec, scalar) style specialization, use as gatekeeper for applying said specialization
		const bool					alwaysScalar	= expression.find("${MT}")!=string::npos;

		shaderTemplateParams["GLES_VERSION"]	= version == glu::GLSL_VERSION_300_ES ? "300 es" : "100";
		shaderTemplateParams["CASE_BASE_TYPE"]	= glu::getDataTypeName(outType);
		shaderTemplateParams["DECLARATIONS"]	= "${DECLARATIONS}";
		shaderTemplateParams["OUTPUT"]			= "${OUTPUT}";

		for (int compCount = minComponents-1; compCount < maxComponents; compCount++)
		{
			vector<tcu::TestNode*>		children;
			std::map<string, string>	expressionTemplateParams;
			string						typeName			= glu::getDataTypeName((glu::DataType)(inType + compCount)); // results in float, vec2, vec3, vec4 progression (same for other primitive types)
			const char*					componentAccess[]	= {"", ".y", ".z", ".w"};
			const tcu::StringTemplate	expressionTemplate	(expression);
			// Add type to case name if we are generating multiple versions
			const string				caseName			= string(cases[caseNdx].name) + (minComponents==maxComponents ? "" : ("_" + typeName));

			// ${T} => final type, ${MT} => final type but with scalar version usable even when T is a vector
			expressionTemplateParams["T"]			= typeName;
			expressionTemplateParams["MT"]			= typeName;

			shaderTemplateParams["CASE_EXPRESSION"]	= expressionTemplate.specialize(expressionTemplateParams) + componentAccess[compCount]; // Add vector access to expression as needed

			{
				const string mapped = shaderTemplate.specialize(shaderTemplateParams);

				if (testStage & SHADER_VERTEX)
				{
					glu::sl::ShaderCaseSpecification	spec;

					spec.targetVersion	= version;
					spec.expectResult	= glu::sl::EXPECT_PASS;
					spec.caseType		= glu::sl::CASETYPE_VERTEX_ONLY;
					spec.programs.resize(1);

					spec.programs[0].sources << glu::VertexSource(mapped);

					addOutputVar(&spec.values, outType, cases[caseNdx].output);

					ret.push_back(new ShaderLibraryCase(testContext,
														renderContext,
														contextInfo,
														(caseName + "_vertex").c_str(),
														"",
														spec));
				}

				if (testStage & SHADER_FRAGMENT)
				{
					glu::sl::ShaderCaseSpecification	spec;

					spec.targetVersion	= version;
					spec.expectResult	= glu::sl::EXPECT_PASS;
					spec.caseType		= glu::sl::CASETYPE_FRAGMENT_ONLY;
					spec.programs.resize(1);

					spec.programs[0].sources << glu::FragmentSource(mapped);

					addOutputVar(&spec.values, outType, cases[caseNdx].output);

					ret.push_back(new ShaderLibraryCase(testContext,
														renderContext,
														contextInfo,
														(caseName + "_fragment").c_str(),
														"",
														spec));
				}
			}

			// Deal with functions that allways accept one ore more scalar parameters even when others are vectors
			if (alwaysScalar && compCount > 0)
			{
				const string	scalarCaseName	= string(cases[caseNdx].name) + "_" + typeName + "_" + glu::getDataTypeName(inType);

				expressionTemplateParams["MT"] = glu::getDataTypeName(inType);
				shaderTemplateParams["CASE_EXPRESSION"]	= expressionTemplate.specialize(expressionTemplateParams) + componentAccess[compCount];

				{
					const string mapped = shaderTemplate.specialize(shaderTemplateParams);

					if (testStage & SHADER_VERTEX)
					{
						glu::sl::ShaderCaseSpecification	spec;

						spec.targetVersion	= version;
						spec.expectResult	= glu::sl::EXPECT_PASS;
						spec.caseType		= glu::sl::CASETYPE_VERTEX_ONLY;
						spec.programs.resize(1);

						spec.programs[0].sources << glu::VertexSource(mapped);

						addOutputVar(&spec.values, outType, cases[caseNdx].output);

						ret.push_back(new ShaderLibraryCase(testContext,
															renderContext,
															contextInfo,
															(scalarCaseName + "_vertex").c_str(),
															"",
															spec));
					}

					if (testStage & SHADER_FRAGMENT)
					{
						glu::sl::ShaderCaseSpecification	spec;

						spec.targetVersion	= version;
						spec.expectResult	= glu::sl::EXPECT_PASS;
						spec.caseType		= glu::sl::CASETYPE_FRAGMENT_ONLY;
						spec.programs.resize(1);

						spec.programs[0].sources << glu::FragmentSource(mapped);

						addOutputVar(&spec.values, outType, cases[caseNdx].output);

						ret.push_back(new ShaderLibraryCase(testContext,
															renderContext,
															contextInfo,
															(scalarCaseName + "_fragment").c_str(),
															"",
															spec));
					}
				}
			}
		}
	}

	return ret;
}